

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1515.c
# Opt level: O1

int test(char *URL)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  timeval tVar12;
  int still_running;
  timeval timeout;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  char target_url [256];
  char dns_entry [256];
  int local_3e4;
  long local_3e0;
  int local_3d8;
  int local_3d4;
  char *local_3d0;
  timeval local_3c8;
  fd_set local_3b8;
  fd_set local_338;
  fd_set local_2b8;
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  pcVar1 = libtest_arg3;
  local_3d0 = URL;
  curl_msnprintf(local_138,0x100,"testserver.example.com:%s:%s",libtest_arg3,libtest_arg2);
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar6 = _stderr;
  iVar4 = 0;
  if (iVar2 != 0) {
    uVar5 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                  ,0x82,iVar2,uVar5);
    iVar4 = iVar2;
  }
  if (iVar4 == 0) {
    local_3e0 = curl_multi_init();
    if (local_3e0 != 0) {
      iVar2 = 1;
LAB_00102397:
      curl_msnprintf(local_238,0x100,"http://testserver.example.com:%s/%s%04d",pcVar1,local_3d0,
                     iVar2);
      uVar6 = curl_slist_append(0,local_138);
      lVar7 = curl_easy_init();
      if (lVar7 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x41);
        iVar4 = 0x7c;
        goto LAB_00102a90;
      }
      iVar3 = curl_easy_setopt(lVar7,0x2712,local_238);
      uVar5 = _stderr;
      iVar4 = 0;
      if (iVar3 != 0) {
        uVar8 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x43,iVar3,uVar8);
        iVar4 = iVar3;
      }
      if (iVar4 != 0) goto LAB_00102a90;
      iVar3 = curl_easy_setopt(lVar7,0x27db,uVar6);
      uVar5 = _stderr;
      iVar4 = 0;
      if (iVar3 != 0) {
        uVar8 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x44,iVar3,uVar8);
        iVar4 = iVar3;
      }
      if (iVar4 != 0) goto LAB_00102a90;
      iVar3 = curl_easy_setopt(lVar7,0x4e7e,debug_callback);
      uVar5 = _stderr;
      iVar4 = 0;
      if (iVar3 != 0) {
        uVar8 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x45,iVar3,uVar8);
        iVar4 = iVar3;
      }
      if (iVar4 != 0) goto LAB_00102a90;
      iVar3 = curl_easy_setopt(lVar7,0x29,1);
      uVar5 = _stderr;
      iVar4 = 0;
      if (iVar3 != 0) {
        uVar8 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x46,iVar3,uVar8);
        iVar4 = iVar3;
      }
      if (iVar4 != 0) goto LAB_00102a90;
      iVar3 = curl_easy_setopt(lVar7,0x5c,1);
      uVar5 = _stderr;
      iVar4 = 0;
      if (iVar3 != 0) {
        uVar8 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x47,iVar3,uVar8);
        iVar4 = iVar3;
      }
      if (iVar4 != 0) goto LAB_00102a90;
      iVar4 = curl_multi_add_handle(local_3e0,lVar7);
      uVar5 = _stderr;
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        uVar8 = curl_multi_strerror(iVar4);
        curl_mfprintf(uVar5,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x49,iVar4,uVar8);
      }
      if (iVar4 != 0) goto LAB_00102a90;
      iVar4 = curl_multi_perform(local_3e0,&local_3e4);
      uVar5 = _stderr;
      if (iVar4 == 0) {
        iVar4 = 0;
        if (local_3e4 < 0) {
          curl_mfprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                        ,0x4a);
          iVar4 = 0x7a;
        }
      }
      else {
        uVar8 = curl_multi_strerror(iVar4);
        curl_mfprintf(uVar5,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x4a,iVar4,uVar8);
      }
      if (iVar4 != 0) goto LAB_00102a90;
      tVar12 = tutil_tvnow();
      lVar9 = tutil_tvdiff(tVar12,tv_test_start);
      if (60000 < lVar9) {
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                      ,0x4c);
        iVar4 = 0x7d;
        goto LAB_00102a90;
      }
      iVar4 = 0;
      do {
        if (local_3e4 == 0) goto LAB_00102ad9;
        local_3d8 = -99;
        local_3b8.__fds_bits[0] = 0;
        local_3b8.__fds_bits[1] = 0;
        local_3b8.__fds_bits[2] = 0;
        local_3b8.__fds_bits[3] = 0;
        local_3b8.__fds_bits[4] = 0;
        local_3b8.__fds_bits[5] = 0;
        local_3b8.__fds_bits[6] = 0;
        local_3b8.__fds_bits[7] = 0;
        local_3b8.__fds_bits[8] = 0;
        local_3b8.__fds_bits[9] = 0;
        local_3b8.__fds_bits[10] = 0;
        local_3b8.__fds_bits[0xb] = 0;
        local_3b8.__fds_bits[0xc] = 0;
        local_3b8.__fds_bits[0xd] = 0;
        local_3b8.__fds_bits[0xe] = 0;
        local_3b8.__fds_bits[0xf] = 0;
        local_2b8.__fds_bits[0] = 0;
        local_2b8.__fds_bits[1] = 0;
        local_2b8.__fds_bits[2] = 0;
        local_2b8.__fds_bits[3] = 0;
        local_2b8.__fds_bits[4] = 0;
        local_2b8.__fds_bits[5] = 0;
        local_2b8.__fds_bits[6] = 0;
        local_2b8.__fds_bits[7] = 0;
        local_2b8.__fds_bits[8] = 0;
        local_2b8.__fds_bits[9] = 0;
        local_2b8.__fds_bits[10] = 0;
        local_2b8.__fds_bits[0xb] = 0;
        local_2b8.__fds_bits[0xc] = 0;
        local_2b8.__fds_bits[0xd] = 0;
        local_2b8.__fds_bits[0xe] = 0;
        local_2b8.__fds_bits[0xf] = 0;
        local_338.__fds_bits[0xe] = 0;
        local_338.__fds_bits[0xf] = 0;
        local_338.__fds_bits[0xc] = 0;
        local_338.__fds_bits[0xd] = 0;
        local_338.__fds_bits[10] = 0;
        local_338.__fds_bits[0xb] = 0;
        local_338.__fds_bits[8] = 0;
        local_338.__fds_bits[9] = 0;
        local_338.__fds_bits[6] = 0;
        local_338.__fds_bits[7] = 0;
        local_338.__fds_bits[4] = 0;
        local_338.__fds_bits[5] = 0;
        local_338.__fds_bits[2] = 0;
        local_338.__fds_bits[3] = 0;
        local_338.__fds_bits[0] = 0;
        local_338.__fds_bits[1] = 0;
        local_3c8.tv_sec = 1;
        local_3c8.tv_usec = 0;
        iVar3 = curl_multi_fdset(local_3e0,&local_3b8,&local_2b8,&local_338,&local_3d8);
        uVar5 = _stderr;
        if (iVar3 == 0) {
          if (local_3d8 < -1) {
            curl_mfprintf(_stderr,
                          "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                          ,0x59);
            iVar4 = 0x7a;
          }
        }
        else {
          uVar8 = curl_multi_strerror(iVar3);
          curl_mfprintf(uVar5,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                        ,0x59,iVar3,uVar8);
          iVar4 = iVar3;
        }
        iVar3 = 6;
        if (iVar4 == 0) {
          iVar3 = select_wrapper(local_3d8 + 1,&local_3b8,&local_2b8,&local_338,&local_3c8);
          iVar4 = 0;
          if (iVar3 == -1) {
            local_3d4 = iVar3;
            piVar10 = __errno_location();
            uVar5 = _stderr;
            iVar4 = *piVar10;
            pcVar11 = strerror(iVar4);
            curl_mfprintf(uVar5,"%s:%d select() failed, with errno %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                          ,0x5a,iVar4,pcVar11);
            iVar4 = 0x79;
            iVar3 = local_3d4;
          }
          if (iVar3 != -1) {
            tVar12 = tutil_tvnow();
            lVar9 = tutil_tvdiff(tVar12,tv_test_start);
            if (lVar9 < 0xea61) {
              iVar4 = curl_multi_perform(local_3e0,&local_3e4);
              uVar5 = _stderr;
              if (iVar4 == 0) {
                iVar4 = 0;
                if (local_3e4 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                                ,0x5d);
                  iVar4 = 0x7a;
                }
              }
              else {
                uVar8 = curl_multi_strerror(iVar4);
                curl_mfprintf(uVar5,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                              ,0x5d,iVar4,uVar8);
              }
              if (iVar4 == 0) {
                tVar12 = tutil_tvnow();
                lVar9 = tutil_tvdiff(tVar12,tv_test_start);
                iVar4 = 0;
                iVar3 = 0;
                if (lVar9 < 0xea61) goto LAB_00102a83;
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                              ,0x5f);
                iVar4 = 0x7d;
              }
            }
            else {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                            ,0x5c);
              iVar4 = 0x7d;
            }
          }
          iVar3 = 6;
        }
LAB_00102a83:
      } while (iVar3 == 0);
      if (iVar3 == 6) goto LAB_00102a90;
      goto LAB_00102aad;
    }
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                  ,0x83);
    iVar4 = 0x7b;
LAB_00102b05:
    curl_multi_cleanup(local_3e0);
  }
LAB_00102b11:
  return iVar4;
  while ((*piVar10 != 1 || (*(long *)(piVar10 + 2) != lVar7))) {
LAB_00102ad9:
    piVar10 = (int *)curl_multi_info_read(local_3e0,&local_3b8);
    if (piVar10 == (int *)0x0) goto LAB_00102a90;
  }
  iVar4 = piVar10[4];
LAB_00102a90:
  curl_multi_remove_handle(local_3e0,lVar7);
  curl_easy_cleanup(lVar7);
  curl_slist_free_all(uVar6);
LAB_00102aad:
  iVar3 = 0xc;
  if ((iVar4 == 0) && (iVar3 = 0, iVar2 != 2)) {
    sleep(2);
  }
  if (iVar3 != 0) {
    if (iVar3 != 0xc) goto LAB_00102b11;
    goto LAB_00102b05;
  }
  iVar2 = iVar2 + 1;
  if (iVar2 == 3) goto LAB_00102b05;
  goto LAB_00102397;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  int res = 0;
  char *address = libtest_arg2;
  char *port = libtest_arg3;
  char *path = URL;
  char dns_entry[256];
  int i;
  int count = 2;

  snprintf(dns_entry, sizeof(dns_entry), "testserver.example.com:%s:%s",
           port, address);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);
  multi_init(multi);

  for(i = 1; i <= count; i++) {
    char target_url[256];
    snprintf(target_url, sizeof(target_url),
             "http://testserver.example.com:%s/%s%04d", port, path, i);

    /* second request must succeed like the first one */
    res = do_one_request(multi, target_url, dns_entry);
    if(res)
      goto test_cleanup;

    if(i < count)
      sleep(DNS_TIMEOUT + 1);
  }

test_cleanup:

  curl_multi_cleanup(multi);

  return (int) res;
}